

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_pred_context_single_ref_p1(MACROBLOCKD *xd)

{
  uint uVar1;
  uint uVar2;
  int local_20;
  int pred_context;
  int bwd_count;
  int fwd_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  uVar1 = (uint)xd->neighbors_ref_counts[1] + (uint)xd->neighbors_ref_counts[2] +
          (uint)xd->neighbors_ref_counts[3] + (uint)xd->neighbors_ref_counts[4];
  uVar2 = (uint)xd->neighbors_ref_counts[5] + (uint)xd->neighbors_ref_counts[6] +
          (uint)xd->neighbors_ref_counts[7];
  if (uVar1 == uVar2) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (uVar1 < uVar2) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

int av1_get_pred_context_single_ref_p1(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of forward reference frames
  const int fwd_count = ref_counts[LAST_FRAME] + ref_counts[LAST2_FRAME] +
                        ref_counts[LAST3_FRAME] + ref_counts[GOLDEN_FRAME];
  // Count of backward reference frames
  const int bwd_count = ref_counts[BWDREF_FRAME] + ref_counts[ALTREF2_FRAME] +
                        ref_counts[ALTREF_FRAME];

  const int pred_context =
      (fwd_count == bwd_count) ? 1 : ((fwd_count < bwd_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}